

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetNodeID::AddInteger(FoldingSetNodeID *this,unsigned_long I)

{
  unsigned_long I_local;
  FoldingSetNodeID *this_local;
  
  AddInteger(this,I);
  return;
}

Assistant:

void FoldingSetNodeID::AddInteger(unsigned long I) {
  if (sizeof(long) == sizeof(int))
    AddInteger(unsigned(I));
  else if (sizeof(long) == sizeof(long long)) {
    AddInteger((unsigned long long)I);
  } else {
    llvm_unreachable("unexpected sizeof(long)");
  }
}